

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logger.cpp
# Opt level: O3

double Logger::log(double __x)

{
  char in_AL;
  int iVar1;
  char *in_RSI;
  uint in_EDI;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double dVar2;
  char *buffer;
  va_list argp;
  char *local_e0;
  undefined8 local_d8;
  char **local_d0;
  undefined1 *local_c8;
  undefined1 local_b8 [48];
  double local_88;
  
  local_c8 = local_b8;
  if (in_AL != '\0') {
    local_88 = __x;
  }
  local_d0 = &buffer;
  local_d8 = 0x3000000010;
  local_e0 = (char *)0x0;
  iVar1 = vasprintf(&local_e0,in_RSI,&local_d8);
  dVar2 = extraout_XMM0_Qa;
  if (0 < iVar1) {
    getDefaultSinkPointer();
    (*getDefaultSinkPointer::defaultSink->_vptr_OutputSink[1])
              (getDefaultSinkPointer::defaultSink,local_e0,(ulong)in_EDI);
    free(local_e0);
    dVar2 = extraout_XMM0_Qa_00;
  }
  return dVar2;
}

Assistant:

void log(const unsigned int flags, const char * format, ...)
    {
        va_list argp;
        va_start(argp, format);
        char * buffer = 0;
        // We use vasprintf extension to avoid dual parsing of the format string to find out the required length
        const int err = vasprintf(&buffer, format, argp);
        if (err <= 0) return;
        getDefaultSink().gotMessage(buffer, flags);
        free(buffer);
    }